

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O2

void __thiscall QListViewPrivate::selectAll(QListViewPrivate *this,SelectionFlags command)

{
  QPersistentModelIndex *this_00;
  QAbstractItemModel *pQVar1;
  QObject *pQVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int row;
  long in_FS_OFFSET;
  bool bVar6;
  QModelIndex local_b0;
  QModelIndex local_98;
  undefined8 local_78;
  undefined1 *puStack_70;
  totally_ordered_wrapper<const_QAbstractItemModel_*> tStack_68;
  QArrayDataPointer<QItemSelectionRange> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = QPointer::operator_cast_to_bool
                    ((QPointer *)&(this->super_QAbstractItemViewPrivate).selectionModel);
  if (bVar3) {
    local_58.size = 0;
    local_78 = (undefined1 *)0xffffffffffffffff;
    local_58.d = (Data *)0x0;
    local_58.ptr = (QItemSelectionRange *)0x0;
    puStack_70 = (undefined1 *)0x0;
    tStack_68.ptr = (QAbstractItemModel *)0x0;
    pQVar1 = (this->super_QAbstractItemViewPrivate).model;
    this_00 = &(this->super_QAbstractItemViewPrivate).root;
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_98,this_00);
    iVar4 = (**(code **)(*(long *)pQVar1 + 0x80))(pQVar1,&local_98);
    pQVar1 = (this->super_QAbstractItemViewPrivate).model;
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_98,this_00);
    iVar5 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,&local_98);
    row = 0;
    if (iVar5 < 1) {
      iVar5 = 0;
    }
    for (; iVar5 != row; row = row + 1) {
      bVar3 = isHidden(this,row);
      bVar6 = (int)(local_78._4_4_ | (uint)local_78) < 0;
      if (bVar3) {
        if (tStack_68.ptr != (QAbstractItemModel *)0x0 && !bVar6) {
          local_98.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
          local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_98.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
          pQVar1 = (this->super_QAbstractItemViewPrivate).model;
          QPersistentModelIndex::operator_cast_to_QModelIndex(&local_b0,this_00);
          (**(code **)(*(long *)pQVar1 + 0x60))(&local_98,pQVar1,row + -1,iVar4 + -1,&local_b0);
          QItemSelectionRange::QItemSelectionRange
                    ((QItemSelectionRange *)&local_b0,(QModelIndex *)&local_78,&local_98);
          QList<QItemSelectionRange>::emplaceBack<QItemSelectionRange>
                    ((QList<QItemSelectionRange> *)&local_58,(QItemSelectionRange *)&local_b0);
          QItemSelectionRange::~QItemSelectionRange((QItemSelectionRange *)&local_b0);
          puStack_70 = (undefined1 *)0x0;
          tStack_68.ptr = (QAbstractItemModel *)0x0;
          local_78 = (undefined1 *)0xffffffffffffffff;
        }
      }
      else if (tStack_68.ptr == (QAbstractItemModel *)0x0 || bVar6) {
        pQVar1 = (this->super_QAbstractItemViewPrivate).model;
        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_b0,this_00);
        (**(code **)(*(long *)pQVar1 + 0x60))(&local_98,pQVar1,row,0,&local_b0);
        tStack_68.ptr = local_98.m.ptr;
        local_78 = (undefined1 *)local_98._0_8_;
        puStack_70 = (undefined1 *)local_98.i;
      }
    }
    if (((-1 < (int)(uint)local_78) && (-1 < (long)local_78)) &&
       (tStack_68.ptr != (QAbstractItemModel *)0x0)) {
      local_98.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_98.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
      pQVar1 = (this->super_QAbstractItemViewPrivate).model;
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_b0,this_00);
      (**(code **)(*(long *)pQVar1 + 0x60))(&local_98,pQVar1,iVar5 + -1,iVar4 + -1,&local_b0);
      QItemSelectionRange::QItemSelectionRange
                ((QItemSelectionRange *)&local_b0,(QModelIndex *)&local_78,&local_98);
      QList<QItemSelectionRange>::emplaceBack<QItemSelectionRange>
                ((QList<QItemSelectionRange> *)&local_58,(QItemSelectionRange *)&local_b0);
      QItemSelectionRange::~QItemSelectionRange((QItemSelectionRange *)&local_b0);
    }
    if (local_58.size != 0) {
      pQVar2 = (this->super_QAbstractItemViewPrivate).selectionModel.wp.value;
      (**(code **)(*(long *)pQVar2 + 0x70))
                (pQVar2,&local_58,
                 command.super_QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>.
                 super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i);
    }
    QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QListViewPrivate::selectAll(QItemSelectionModel::SelectionFlags command)
{
    if (!selectionModel)
        return;

    QItemSelection selection;
    QModelIndex topLeft;
    int row = 0;
    const int colCount = model->columnCount(root);
    const int rowCount = model->rowCount(root);
    for ( ; row < rowCount; ++row) {
        if (isHidden(row)) {
            //it might be the end of a selection range
            if (topLeft.isValid()) {
                QModelIndex bottomRight = model->index(row - 1, colCount - 1, root);
                selection.append(QItemSelectionRange(topLeft, bottomRight));
                topLeft = QModelIndex();
            }
            continue;
        }

        if (!topLeft.isValid()) //start of a new selection range
            topLeft = model->index(row, 0, root);
    }

    if (topLeft.isValid()) {
        //last selected range
        QModelIndex bottomRight = model->index(row - 1, colCount - 1, root);
        selection.append(QItemSelectionRange(topLeft, bottomRight));
    }

    if (!selection.isEmpty())
        selectionModel->select(selection, command);
}